

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::accumulateDerivativesDispatch1<true>
          (BeagleCPUImpl<double,_2,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  double *in_RCX;
  double *in_RDX;
  BeagleCPUImpl<double,_2,_0> *in_RSI;
  double *in_RDI;
  
  if (in_RDX == (double *)0x0) {
    BeagleCPUImpl<double,2,0>::accumulateDerivativesDispatch2<true,false>
              (in_RSI,(double *)0x0,in_RCX,in_RDI);
  }
  else {
    BeagleCPUImpl<double,2,0>::accumulateDerivativesDispatch2<true,true>
              (in_RSI,in_RDX,in_RCX,in_RDI);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE template <bool DoDerivatives>
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch1(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumDerivatives == NULL) {
        accumulateDerivativesDispatch2<DoDerivatives, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch2<DoDerivatives, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}